

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks.c
# Opt level: O2

CURLcode socks_proxy_cf_connect(Curl_cfilter *cf,Curl_easy *data,_Bool blocking,_Bool *done)

{
  uchar *puVar1;
  undefined1 *puVar2;
  connectdata *conn;
  connectdata *pcVar3;
  sockaddr *psVar4;
  curl_trc_feat *pcVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  _Bool _Var9;
  ushort uVar10;
  CURLcode CVar11;
  uint uVar12;
  int iVar13;
  resolve_t rVar14;
  CURLproxycode CVar15;
  socks_state *sx;
  long lVar16;
  size_t sVar17;
  Curl_dns_entry *pCVar18;
  size_t __n;
  char *pcVar19;
  uchar uVar20;
  long lVar21;
  int code;
  ulong uVar22;
  Curl_addrinfo *pCVar23;
  char *pcVar24;
  ulong uVar25;
  connect_t cVar26;
  byte bVar27;
  ssize_t sVar28;
  Curl_dns_entry *dns;
  char *local_90;
  char *local_88;
  uchar ip4 [4];
  char dest [46];
  
  if ((cf->field_0x24 & 1) != 0) {
    CVar11 = CURLE_OK;
    _Var9 = true;
    goto LAB_00152aa6;
  }
  sx = (socks_state *)cf->ctx;
  conn = cf->conn;
  iVar13 = cf->sockindex;
  CVar11 = (*cf->next->cft->do_connect)(cf->next,data,blocking,done);
  if (CVar11 != CURLE_OK) {
    return CVar11;
  }
  if (*done != true) {
    return CURLE_OK;
  }
  if (sx == (socks_state *)0x0) {
    sx = (socks_state *)(*Curl_ccalloc)(1,0x290);
    if (sx == (socks_state *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    cf->ctx = sx;
  }
  cVar26 = sx->state;
  if (cVar26 == CONNECT_INIT) {
    sx->state = CONNECT_SOCKS_INIT;
    lVar16 = 0xf0;
    if (((((ulong)conn->bits & 1) == 0) && (lVar16 = 0x98, (SUB84(conn->bits,0) >> 8 & 1) == 0)) &&
       (lVar16 = 0x68, iVar13 == 1)) {
      lVar16 = 0x80;
    }
    sx->hostname = *(char **)((long)&(conn->cpool_node)._list + lVar16);
    if (((ulong)conn->bits & 1) == 0) {
      if (iVar13 == 1) {
        uVar12 = (uint)conn->secondary_port;
      }
      else if ((SUB84(conn->bits,0) >> 9 & 1) == 0) {
        uVar12 = conn->remote_port;
      }
      else {
        uVar12 = conn->conn_to_port;
      }
    }
    else {
      uVar12 = (conn->http_proxy).port;
    }
    sx->remote_port = uVar12;
    uVar6 = *(undefined4 *)((long)&(conn->socks_proxy).user + 4);
    uVar7 = *(undefined4 *)&(conn->socks_proxy).passwd;
    uVar8 = *(undefined4 *)((long)&(conn->socks_proxy).passwd + 4);
    *(undefined4 *)&sx->proxy_user = *(undefined4 *)&(conn->socks_proxy).user;
    *(undefined4 *)((long)&sx->proxy_user + 4) = uVar6;
    *(undefined4 *)&sx->proxy_password = uVar7;
    *(undefined4 *)((long)&sx->proxy_password + 4) = uVar8;
    cVar26 = CONNECT_SOCKS_INIT;
  }
  pcVar3 = cf->conn;
  bVar27 = (pcVar3->socks_proxy).proxytype;
  switch(bVar27) {
  case 4:
  case 6:
    break;
  case 5:
  case 7:
    pcVar24 = sx->hostname;
    local_90 = (char *)(ulong)bVar27;
    sVar17 = strlen(pcVar24);
    bVar27 = (data->set).socks5auth;
    dns = (Curl_dns_entry *)0x0;
    lVar16 = 0;
    if (0xf < cVar26 - CONNECT_SOCKS_INIT) {
switchD_00152c1a_caseD_5:
      if (((data->set).field_0x8cd & 0x10) == 0) {
LAB_00153f17:
        CVar15 = CURLPX_OK;
      }
      else {
        pcVar5 = (data->state).feat;
        if ((pcVar5 == (curl_trc_feat *)0x0) || (CVar15 = CURLPX_OK, 0 < pcVar5->log_level)) {
          Curl_infof(data,"SOCKS5 request granted.");
          CVar15 = CURLPX_OK;
        }
      }
      goto LAB_00153ea9;
    }
    puVar1 = sx->buffer;
    switch(cVar26) {
    case CONNECT_SOCKS_INIT:
      if (((((ulong)pcVar3->bits & 1) != 0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
         ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 || (0 < pcVar5->log_level))))
      {
        Curl_infof(data,"SOCKS5: connecting to HTTP proxy %s port %d",pcVar24);
      }
      if (((char)local_90 == '\x05') || (sVar17 < 0x100)) {
        if ((((bVar27 & 0xfa) != 0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
           ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 || (0 < pcVar5->log_level))
           )) {
          Curl_infof(data,"warning: unsupported value passed to CURLOPT_SOCKS5_AUTH: %u",
                     (ulong)bVar27);
        }
        if ((bVar27 & 1) == 0) {
          sx->proxy_user = (char *)0x0;
          sx->buffer[0] = '\x05';
          sVar28 = 3;
          lVar16 = 0x12;
          uVar20 = '\0';
LAB_001534c8:
          sx->buffer[lVar16 + -0x10] = uVar20;
        }
        else {
          pcVar24 = sx->proxy_user;
          sx->buffer[0] = '\x05';
          sx->buffer[2] = '\0';
          if (pcVar24 != (char *)0x0) {
            sVar28 = 4;
            uVar20 = '\x02';
            lVar16 = 0x13;
            goto LAB_001534c8;
          }
          sVar28 = 3;
        }
        sx->buffer[1] = (char)sVar28 + 0xfe;
        sx->outp = puVar1;
        sx->outstanding = sVar28;
        CVar15 = socks_state_send(cf,sx,data,CURLPX_SEND_CONNECT,"initial SOCKS5 request");
        if (CVar15 == CURLPX_OK) {
          if (sx->outstanding == 0) {
            if (sx->state != CONNECT_SOCKS_READ) {
              sx->state = CONNECT_SOCKS_READ;
            }
            goto switchD_00152c1a_caseD_3;
          }
          CVar15 = CURLPX_OK;
        }
      }
      else {
        Curl_failf(data,
                   "SOCKS5: the destination hostname is too long to be resolved remotely by the proxy."
                  );
        CVar15 = CURLPX_LONG_HOSTNAME;
      }
      goto LAB_00153ea9;
    case CONNECT_SOCKS_SEND:
      CVar15 = socks_state_send(cf,sx,data,CURLPX_SEND_CONNECT,"initial SOCKS5 request");
      if (CVar15 != CURLPX_OK) goto LAB_00153ea9;
      if (sx->outstanding == 0) goto switchD_00152c1a_caseD_3;
      goto LAB_00153f17;
    case CONNECT_SOCKS_READ_INIT:
switchD_00152c1a_caseD_3:
      sx->outstanding = 2;
      sx->outp = puVar1;
      break;
    case CONNECT_GSSAPI_INIT:
      goto switchD_00152c1a_caseD_5;
    case CONNECT_AUTH_INIT:
      goto switchD_00152c1a_caseD_6;
    case CONNECT_AUTH_SEND:
      goto switchD_00152c1a_caseD_7;
    case CONNECT_AUTH_READ:
      goto switchD_00152c1a_caseD_8;
    case CONNECT_REQ_INIT:
      goto switchD_00152c1a_caseD_9;
    case CONNECT_RESOLVING:
      pCVar18 = Curl_fetch_addr(data,pcVar24,sx->remote_port);
      dns = pCVar18;
      if (pCVar18 == (Curl_dns_entry *)0x0) {
        CVar11 = Curl_resolv_check(data,&dns);
        pCVar18 = dns;
        if (dns == (Curl_dns_entry *)0x0) {
          CVar15 = CURLPX_RESOLVE_HOST;
          if (CVar11 == CURLE_OK) {
            CVar15 = CURLPX_OK;
          }
          goto LAB_00153ea9;
        }
      }
      else {
        (data->state).async.dns = pCVar18;
        puVar2 = &(data->state).async.field_0x28;
        *puVar2 = *puVar2 | 1;
        if ((((data->set).field_0x8cd & 0x10) != 0) &&
           ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 || (0 < pcVar5->log_level))
           )) {
          Curl_infof(data,"SOCKS5: hostname \'%s\' found",sx->hostname);
        }
      }
      goto LAB_0015349f;
    case CONNECT_RESOLVED:
      goto switchD_00152c1a_caseD_b;
    case CONNECT_RESOLVE_REMOTE:
      sx->buffer[0] = '\x05';
      sx->buffer[1] = '\x01';
      sx->buffer[2] = '\0';
      if ((char)local_90 == '\x05') {
        lVar16 = 3;
        goto switchD_00152c1a_caseD_d;
      }
      goto LAB_00153955;
    case CONNECT_REQ_SEND:
      goto switchD_00152c1a_caseD_d;
    case CONNECT_REQ_SENDING:
      goto switchD_00152c1a_caseD_e;
    case CONNECT_REQ_READ:
      goto switchD_00152c1a_caseD_f;
    case CONNECT_REQ_READ_MORE:
      goto switchD_00152c1a_caseD_10;
    }
    CVar15 = socks_state_recv(cf,sx,data,CURLPX_RECV_CONNECT,"initial SOCKS5 response");
    if (CVar15 != CURLPX_OK) goto LAB_00153ea9;
    if (sx->outstanding != 0) {
LAB_001538ea:
      CVar15 = CURLPX_OK;
      goto LAB_00153ea9;
    }
    if (*puVar1 != '\x05') {
      Curl_failf(data,"Received invalid version in initial SOCKS5 response.");
      goto LAB_001532ac;
    }
    uVar20 = sx->buffer[1];
    if (uVar20 == 0xff) {
      Curl_failf(data,"No authentication method was acceptable.");
      CVar15 = CURLPX_NO_AUTH;
      goto LAB_00153ea9;
    }
    if (uVar20 == '\x01') {
      Curl_failf(data,"SOCKS5 GSSAPI per-message authentication is not supported.");
      CVar15 = CURLPX_GSSAPI_PERMSG;
      goto LAB_00153ea9;
    }
    if (uVar20 == '\x02') {
      if (sx->state != CONNECT_AUTH_INIT) {
        sx->state = CONNECT_AUTH_INIT;
      }
switchD_00152c1a_caseD_6:
      pcVar24 = sx->proxy_user;
      if ((pcVar24 == (char *)0x0) || (pcVar19 = sx->proxy_password, pcVar19 == (char *)0x0)) {
        pcVar19 = (char *)0x0;
        __n = 0;
      }
      else {
        local_88 = pcVar24;
        __n = strlen(pcVar24);
        pcVar19 = (char *)strlen(pcVar19);
        pcVar24 = local_88;
      }
      sx->buffer[0] = '\x01';
      sx->buffer[1] = (uchar)__n;
      if (__n != 0 && pcVar24 != (char *)0x0) {
        if (0xff < __n) {
          Curl_failf(data,"Excessive username length for proxy auth");
          CVar15 = CURLPX_LONG_USER;
          goto LAB_00153ea9;
        }
        local_88 = pcVar19;
        memcpy(sx->buffer + 2,pcVar24,__n);
        pcVar19 = local_88;
      }
      sx->buffer[__n + 2] = (uchar)pcVar19;
      if (pcVar19 != (char *)0x0 && sx->proxy_password != (char *)0x0) {
        if ((char *)0xff < pcVar19) {
          CVar15 = CURLPX_LONG_PASSWD;
          Curl_failf(data,"Excessive password length for proxy auth");
          goto LAB_00153ea9;
        }
        memcpy(puVar1 + __n + 3,sx->proxy_password,(size_t)pcVar19);
      }
      if (sx->state != CONNECT_AUTH_SEND) {
        sx->state = CONNECT_AUTH_SEND;
      }
      sx->outstanding = (ssize_t)(pcVar19 + __n + 3);
      sx->outp = puVar1;
switchD_00152c1a_caseD_7:
      CVar15 = socks_state_send(cf,sx,data,CURLPX_SEND_AUTH,"SOCKS5 sub-negotiation request");
      if (CVar15 == CURLPX_OK) {
        if (sx->outstanding == 0) {
          sx->outp = puVar1;
          sx->outstanding = 2;
          if (sx->state != CONNECT_AUTH_READ) {
            sx->state = CONNECT_AUTH_READ;
          }
switchD_00152c1a_caseD_8:
          CVar15 = socks_state_recv(cf,sx,data,CURLPX_RECV_AUTH,"SOCKS5 sub-negotiation response");
          if (CVar15 == CURLPX_OK) {
            if (sx->outstanding != 0) goto LAB_001538ea;
            if (sx->buffer[1] == '\0') {
              cVar26 = sx->state;
              goto LAB_00153932;
            }
            Curl_failf(data,"User was rejected by the SOCKS5 server (%d %d).",(ulong)*puVar1);
            CVar15 = CURLPX_USER_REJECTED;
          }
        }
        else {
          CVar15 = CURLPX_OK;
        }
      }
      goto LAB_00153ea9;
    }
    if (uVar20 != '\0') {
      Curl_failf(data,"Undocumented SOCKS5 mode attempted to be used by server.");
      CVar15 = CURLPX_UNKNOWN_MODE;
      goto LAB_00153ea9;
    }
    cVar26 = sx->state;
LAB_00153932:
    if (cVar26 != CONNECT_REQ_INIT) {
      sx->state = CONNECT_REQ_INIT;
    }
switchD_00152c1a_caseD_9:
    if ((char)local_90 == '\x05') {
      CVar15 = CURLPX_RESOLVE_HOST;
      rVar14 = Curl_resolv(data,sx->hostname,sx->remote_port,true,&dns);
      if (rVar14 != CURLRESOLV_ERROR) {
        if (rVar14 == CURLRESOLV_PENDING) {
          CVar15 = CURLPX_OK;
          if (sx->state != CONNECT_RESOLVING) {
            sx->state = CONNECT_RESOLVING;
          }
        }
        else {
          if (sx->state != CONNECT_RESOLVED) {
            sx->state = CONNECT_RESOLVED;
          }
          pCVar18 = dns;
          if (dns == (Curl_dns_entry *)0x0) {
switchD_00152c1a_caseD_b:
            pCVar23 = (Curl_addrinfo *)0x0;
          }
          else {
LAB_0015349f:
            pCVar23 = pCVar18->addr;
          }
          CVar15 = CURLPX_RESOLVE_HOST;
          uVar20 = (data->set).ipver;
          if (uVar20 == '\0') {
            if (pCVar23 != (Curl_addrinfo *)0x0) {
LAB_00153b35:
              Curl_printable_address(pCVar23,dest,0x2e);
              sx->buffer[0] = '\x05';
              sx->buffer[1] = '\x01';
              sx->buffer[2] = '\0';
              if (pCVar23->ai_family == 10) {
                lVar16 = 0x14;
                sx->buffer[3] = '\x04';
                psVar4 = pCVar23->ai_addr;
                for (lVar21 = 0; lVar21 != 0x10; lVar21 = lVar21 + 1) {
                  sx->buffer[lVar21 + 4] = psVar4->sa_data[lVar21 + 6];
                }
                if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
                   ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 ||
                    (0 < pcVar5->log_level)))) {
                  uVar12 = sx->remote_port;
                  pcVar24 = "SOCKS5 connect to [%s]:%d (locally resolved)";
LAB_00153c3c:
                  Curl_infof(data,pcVar24,dest,(ulong)uVar12);
                }
              }
              else if (pCVar23->ai_family == 2) {
                lVar16 = 8;
                sx->buffer[3] = '\x01';
                psVar4 = pCVar23->ai_addr;
                for (lVar21 = 0; lVar21 != 4; lVar21 = lVar21 + 1) {
                  sx->buffer[lVar21 + 4] = psVar4->sa_data[lVar21 + 2];
                }
                if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
                   ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 ||
                    (0 < pcVar5->log_level)))) {
                  uVar12 = sx->remote_port;
                  pcVar24 = "SOCKS5 connect to %s:%d (locally resolved)";
                  goto LAB_00153c3c;
                }
              }
              else {
                Curl_failf(data,"SOCKS5 connection to %s not supported",dest);
                lVar16 = 3;
              }
              Curl_resolv_unlink(data,&dns);
              goto switchD_00152c1a_caseD_d;
            }
          }
          else {
            for (; pCVar23 != (Curl_addrinfo *)0x0; pCVar23 = pCVar23->ai_next) {
              if (pCVar23->ai_family == (uint)(uVar20 != '\x01') * 8 + 2) goto LAB_00153b35;
            }
          }
          Curl_failf(data,"Failed to resolve \"%s\" for SOCKS5 connect.",sx->hostname);
        }
      }
      goto LAB_00153ea9;
    }
    sx->buffer[0] = '\x05';
    sx->buffer[1] = '\x01';
    sx->buffer[2] = '\0';
LAB_00153955:
    if (((pcVar3->bits).field_0x1 & 4) == 0) {
      iVar13 = inet_pton(2,sx->hostname,ip4);
      if (iVar13 == 1) {
        sx->buffer[3] = '\x01';
        *(uchar (*) [4])(sx->buffer + 4) = ip4;
        lVar16 = 8;
      }
      else {
        sx->buffer[3] = '\x03';
        sx->buffer[4] = (uchar)sVar17;
        memcpy(sx->buffer + 5,sx->hostname,sVar17);
        lVar16 = sVar17 + 5;
      }
    }
    else {
      iVar13 = inet_pton(10,sx->hostname,dest);
      if (iVar13 != 1) {
        CVar15 = CURLPX_BAD_ADDRESS_TYPE;
        goto LAB_00153ea9;
      }
      sx->buffer[3] = '\x04';
      *(undefined4 *)(sx->buffer + 4) = dest._0_4_;
      *(undefined4 *)(sx->buffer + 8) = dest._4_4_;
      *(undefined4 *)(sx->buffer + 0xc) = dest._8_4_;
      *(undefined4 *)(sx->buffer + 0x10) = dest._12_4_;
      lVar16 = 0x14;
    }
    if ((((data->set).field_0x8cd & 0x10) != 0) &&
       ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 || (0 < pcVar5->log_level)))) {
      Curl_infof(data,"SOCKS5 connect to %s:%d (remotely resolved)",sx->hostname,
                 (ulong)(uint)sx->remote_port);
    }
switchD_00152c1a_caseD_d:
    sx->buffer[lVar16] = *(uchar *)((long)&sx->remote_port + 1);
    sx->buffer[lVar16 + 1] = (uchar)sx->remote_port;
    sx->outp = puVar1;
    sx->outstanding = lVar16 + 2;
    if (sx->state != CONNECT_REQ_SENDING) {
      sx->state = CONNECT_REQ_SENDING;
    }
switchD_00152c1a_caseD_e:
    CVar15 = socks_state_send(cf,sx,data,CURLPX_SEND_REQUEST,"SOCKS5 connect request");
    if (CVar15 != CURLPX_OK) goto LAB_00153ea9;
    if (sx->outstanding == 0) {
      sx->outstanding = 10;
      sx->outp = puVar1;
      if (sx->state != CONNECT_REQ_READ) {
        sx->state = CONNECT_REQ_READ;
      }
switchD_00152c1a_caseD_f:
      CVar15 = socks_state_recv(cf,sx,data,CURLPX_RECV_REQACK,"SOCKS5 connect request ack");
      if (CVar15 == CURLPX_OK) {
        if (sx->outstanding != 0) goto LAB_00153ea3;
        if (*puVar1 == '\x05') {
          bVar27 = sx->buffer[1];
          if (bVar27 == 0) {
            uVar20 = sx->buffer[3];
            if (uVar20 != '\x01') {
              if (uVar20 == '\x03') {
                if ((ulong)sx->buffer[4] < 4) goto LAB_00153ef7;
                lVar16 = (ulong)sx->buffer[4] + 7;
              }
              else {
                if (uVar20 != '\x04') {
                  Curl_failf(data,"SOCKS5 reply has wrong address type.");
                  CVar15 = CURLPX_BAD_ADDRESS_TYPE;
                  goto LAB_00153ea9;
                }
                lVar16 = 0x16;
              }
              sx->outstanding = lVar16 + -10;
              sx->outp = sx->buffer + 10;
              if (sx->state != CONNECT_REQ_READ_MORE) {
                sx->state = CONNECT_REQ_READ_MORE;
              }
switchD_00152c1a_caseD_10:
              CVar15 = socks_state_recv(cf,sx,data,CURLPX_RECV_ADDRESS,
                                        "SOCKS5 connect request address");
              if (CVar15 != CURLPX_OK) goto LAB_00153ea9;
              if (sx->outstanding != 0) goto LAB_00153ea3;
            }
LAB_00153ef7:
            if (sx->state != CONNECT_DONE) {
              sx->state = CONNECT_DONE;
            }
            if (data != (Curl_easy *)0x0) goto switchD_00152c1a_caseD_5;
            goto LAB_00153f17;
          }
          Curl_failf(data,"cannot complete SOCKS5 connection to %s. (%d)",sx->hostname,(ulong)bVar27
                    );
          if (bVar27 < 9) {
            CVar15 = *(CURLproxycode *)(do_SOCKS5_lookup + (ulong)bVar27 * 4);
          }
          else {
            CVar15 = CURLPX_REPLY_UNASSIGNED;
          }
        }
        else {
          Curl_failf(data,"SOCKS5 reply has wrong version, version should be 5.");
          CVar15 = CURLPX_BAD_VERSION;
        }
      }
      goto LAB_00153ea9;
    }
    goto LAB_00153ea3;
  default:
    Curl_failf(data,"unknown proxytype option given");
    CVar11 = CURLE_COULDNT_CONNECT;
    goto LAB_00153eb7;
  }
  dns = (Curl_dns_entry *)0x0;
  puVar1 = sx->buffer;
  switch(cVar26) {
  case CONNECT_SOCKS_INIT:
    pcVar3->ip_version = '\x01';
    if ((data == (Curl_easy *)0x0) || (((ulong)pcVar3->bits & 1) == 0)) {
      if (data != (Curl_easy *)0x0) goto LAB_00152dbd;
    }
    else {
      if ((((data->set).field_0x8cd & 0x10) != 0) &&
         ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 || (0 < pcVar5->log_level))))
      {
        pcVar24 = "";
        if (bVar27 == 6) {
          pcVar24 = "a";
        }
        Curl_infof(data,"SOCKS4%s: connecting to HTTP proxy %s port %d",pcVar24,sx->hostname,
                   (ulong)(uint)sx->remote_port);
      }
LAB_00152dbd:
      if ((((data->set).field_0x8cd & 0x10) != 0) &&
         ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 || (0 < pcVar5->log_level))))
      {
        Curl_infof(data,"SOCKS4 communication to %s:%d",sx->hostname,(ulong)(uint)sx->remote_port);
      }
    }
    iVar13 = sx->remote_port;
    uVar10 = (ushort)iVar13;
    sx->buffer[0] = '\x04';
    sx->buffer[1] = '\x01';
    *(ushort *)(sx->buffer + 2) = uVar10 << 8 | uVar10 >> 8;
    if (bVar27 == 6) {
      if (sx->state != CONNECT_REQ_INIT) {
        sx->state = CONNECT_REQ_INIT;
      }
      goto switchD_00152b30_caseD_9;
    }
    rVar14 = Curl_resolv(data,sx->hostname,iVar13,true,&dns);
    if (rVar14 == CURLRESOLV_ERROR) {
      CVar15 = CURLPX_RESOLVE_HOST;
    }
    else {
      if (rVar14 != CURLRESOLV_PENDING) {
        cVar26 = sx->state;
        goto joined_r0x00152d6d;
      }
      if (sx->state != CONNECT_RESOLVING) {
        sx->state = CONNECT_RESOLVING;
      }
      CVar15 = CURLPX_OK;
      if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
         ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 || (0 < pcVar5->log_level))))
      {
        Curl_infof(data,"SOCKS4 non-blocking resolve of %s",sx->hostname);
        CVar15 = CURLPX_OK;
      }
    }
    break;
  default:
    goto switchD_00152b30_caseD_2;
  case CONNECT_SOCKS_READ:
    goto switchD_00152b30_caseD_4;
  case CONNECT_REQ_INIT:
switchD_00152b30_caseD_9:
    sx->buffer[8] = '\0';
    pcVar24 = sx->proxy_user;
    if (pcVar24 != (char *)0x0) {
      sVar17 = strlen(pcVar24);
      if (0xff < sVar17) {
        Curl_failf(data,"Too long SOCKS proxy username");
        CVar15 = CURLPX_LONG_USER;
        break;
      }
      memcpy(sx->buffer + 8,pcVar24,sVar17 + 1);
    }
    sVar17 = strlen((char *)(sx->buffer + 8));
    uVar22 = sVar17 + 9;
    if (bVar27 == 6) {
      sx->buffer[4] = '\0';
      sx->buffer[5] = '\0';
      sx->buffer[6] = '\0';
      sx->buffer[7] = '\x01';
      local_90 = sx->hostname;
      sVar17 = strlen(local_90);
      if ((0xff < sVar17 + 1) || (uVar25 = sVar17 + 1 + uVar22, 599 < uVar25)) {
        Curl_failf(data,"SOCKS4: too long hostname");
        CVar15 = CURLPX_LONG_HOSTNAME;
        break;
      }
      strcpy((char *)(puVar1 + uVar22),local_90);
      uVar22 = uVar25;
    }
    sx->outp = puVar1;
    sx->outstanding = uVar22;
    if (sx->state != CONNECT_REQ_SENDING) {
      sx->state = CONNECT_REQ_SENDING;
    }
  case CONNECT_REQ_SENDING:
    CVar15 = socks_state_send(cf,sx,data,CURLPX_SEND_CONNECT,"SOCKS4 connect request");
    if (CVar15 == CURLPX_OK) {
      if (sx->outstanding == 0) {
        sx->outstanding = 8;
        sx->outp = puVar1;
        if (sx->state != CONNECT_SOCKS_READ) {
          sx->state = CONNECT_SOCKS_READ;
        }
switchD_00152b30_caseD_4:
        CVar15 = socks_state_recv(cf,sx,data,CURLPX_RECV_CONNECT,"connect request ack");
        if (CVar15 == CURLPX_OK) {
          if (sx->outstanding != 0) goto LAB_00153ea3;
          if (sx->state != CONNECT_DONE) {
            sx->state = CONNECT_DONE;
          }
switchD_00152b30_caseD_2:
          if (*puVar1 == '\0') {
            switch(sx->buffer[1]) {
            case 'Z':
              CVar15 = CURLPX_OK;
              if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
                 ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 ||
                  (0 < pcVar5->log_level)))) {
                pcVar24 = "";
                if (bVar27 == 6) {
                  pcVar24 = "a";
                }
                Curl_infof(data,"SOCKS4%s request granted.",pcVar24);
                CVar15 = CURLPX_OK;
              }
              break;
            case '[':
              Curl_failf(data,
                         "cannot complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), request rejected or failed."
                         ,(ulong)sx->buffer[4],(ulong)sx->buffer[5],(ulong)sx->buffer[6],
                         (ulong)sx->buffer[7],
                         (ulong)(ushort)(*(ushort *)(sx->buffer + 2) << 8 |
                                        *(ushort *)(sx->buffer + 2) >> 8),0x5b);
              CVar15 = CURLPX_REQUEST_FAILED;
              break;
            case '\\':
              Curl_failf(data,
                         "cannot complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), request rejected because SOCKS server cannot connect to identd on the client."
                         ,(ulong)sx->buffer[4],(ulong)sx->buffer[5],(ulong)sx->buffer[6],
                         (ulong)sx->buffer[7],
                         (ulong)(ushort)(*(ushort *)(sx->buffer + 2) << 8 |
                                        *(ushort *)(sx->buffer + 2) >> 8),0x5c);
              CVar15 = CURLPX_IDENTD;
              break;
            case ']':
              Curl_failf(data,
                         "cannot complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), request rejected because the client program and identd report different user-ids."
                         ,(ulong)sx->buffer[4],(ulong)sx->buffer[5],(ulong)sx->buffer[6],
                         (ulong)sx->buffer[7],
                         (ulong)(ushort)(*(ushort *)(sx->buffer + 2) << 8 |
                                        *(ushort *)(sx->buffer + 2) >> 8),0x5d);
              CVar15 = CURLPX_IDENTD_DIFFER;
              break;
            default:
              Curl_failf(data,"cannot complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), Unknown.",
                         (ulong)sx->buffer[4],(ulong)sx->buffer[5],(ulong)sx->buffer[6],
                         (ulong)sx->buffer[7],
                         (ulong)(ushort)(*(ushort *)(sx->buffer + 2) << 8 |
                                        *(ushort *)(sx->buffer + 2) >> 8),(ulong)sx->buffer[1]);
              CVar15 = CURLPX_UNKNOWN_FAIL;
            }
          }
          else {
            Curl_failf(data,"SOCKS4 reply has wrong version, version should be 0.");
LAB_001532ac:
            CVar15 = CURLPX_BAD_VERSION;
          }
        }
      }
      else {
LAB_00153ea3:
        CVar15 = CURLPX_OK;
      }
    }
    break;
  case CONNECT_RESOLVING:
    local_90 = (char *)(ulong)bVar27;
    dns = Curl_fetch_addr(data,sx->hostname,(pcVar3->primary).remote_port);
    if (dns == (Curl_dns_entry *)0x0) {
      CVar11 = Curl_resolv_check(data,&dns);
      bVar27 = (byte)local_90;
      pCVar18 = dns;
      if (dns == (Curl_dns_entry *)0x0) {
        CVar15 = CURLPX_RESOLVE_HOST;
        if (CVar11 == CURLE_OK) {
          CVar15 = CURLPX_OK;
        }
        break;
      }
    }
    else {
      (data->state).async.dns = dns;
      puVar2 = &(data->state).async.field_0x28;
      *puVar2 = *puVar2 | 1;
      if ((((data->set).field_0x8cd & 0x10) != 0) &&
         ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 || (0 < pcVar5->log_level))))
      {
        Curl_infof(data,"Hostname \'%s\' was found",sx->hostname);
      }
      cVar26 = sx->state;
      bVar27 = (byte)local_90;
joined_r0x00152d6d:
      if (cVar26 != CONNECT_RESOLVED) {
        sx->state = CONNECT_RESOLVED;
      }
      pCVar18 = dns;
      if (dns == (Curl_dns_entry *)0x0) goto switchD_00152b30_caseD_b;
    }
    while (pCVar23 = pCVar18->addr, pCVar23 != (Curl_addrinfo *)0x0) {
      if (pCVar23->ai_family == 2) {
        Curl_printable_address(pCVar23,dest,0x40);
        psVar4 = pCVar23->ai_addr;
        sx->buffer[4] = psVar4->sa_data[2];
        sx->buffer[5] = psVar4->sa_data[3];
        sx->buffer[6] = psVar4->sa_data[4];
        sx->buffer[7] = psVar4->sa_data[5];
        if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
           ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 || (0 < pcVar5->log_level))
           )) {
          Curl_infof(data,"SOCKS4 connect to IPv4 %s (locally resolved)",dest);
        }
        Curl_resolv_unlink(data,&dns);
        goto switchD_00152b30_caseD_9;
      }
      pCVar18 = (Curl_dns_entry *)&pCVar23->ai_next;
    }
    Curl_failf(data,"SOCKS4 connection to %s not supported",sx->hostname);
    CVar15 = CURLPX_RESOLVE_HOST;
    break;
  case CONNECT_RESOLVED:
switchD_00152b30_caseD_b:
    Curl_failf(data,"Failed to resolve \"%s\" for SOCKS4 connect.",sx->hostname);
    CVar15 = CURLPX_RESOLVE_HOST;
  }
LAB_00153ea9:
  if (CVar15 == CURLPX_OK) {
    CVar11 = CURLE_OK;
    if (sx->state == CONNECT_DONE) {
      cf->field_0x24 = cf->field_0x24 | 1;
      Curl_verboseconnect(data,conn,cf->sockindex);
      if (cf->ctx != (void *)0x0) {
        (*Curl_cfree)(cf->ctx);
        cf->ctx = (void *)0x0;
      }
    }
  }
  else {
    (data->info).pxcode = CVar15;
    CVar11 = CURLE_PROXY;
  }
LAB_00153eb7:
  _Var9 = (_Bool)(cf->field_0x24 & 1);
LAB_00152aa6:
  *done = _Var9;
  return CVar11;
}

Assistant:

static CURLcode socks_proxy_cf_connect(struct Curl_cfilter *cf,
                                       struct Curl_easy *data,
                                       bool blocking, bool *done)
{
  CURLcode result;
  struct connectdata *conn = cf->conn;
  int sockindex = cf->sockindex;
  struct socks_state *sx = cf->ctx;

  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  result = cf->next->cft->do_connect(cf->next, data, blocking, done);
  if(result || !*done)
    return result;

  if(!sx) {
    sx = calloc(1, sizeof(*sx));
    if(!sx)
      return CURLE_OUT_OF_MEMORY;
    cf->ctx = sx;
  }

  if(sx->state == CONNECT_INIT) {
    /* for the secondary socket (FTP), use the "connect to host"
     * but ignore the "connect to port" (use the secondary port)
     */
    sxstate(sx, data, CONNECT_SOCKS_INIT);
    sx->hostname =
      conn->bits.httpproxy ?
      conn->http_proxy.host.name :
      conn->bits.conn_to_host ?
      conn->conn_to_host.name :
      sockindex == SECONDARYSOCKET ?
      conn->secondaryhostname : conn->host.name;
    sx->remote_port =
      conn->bits.httpproxy ? (int)conn->http_proxy.port :
      sockindex == SECONDARYSOCKET ? conn->secondary_port :
      conn->bits.conn_to_port ? conn->conn_to_port :
      conn->remote_port;
    sx->proxy_user = conn->socks_proxy.user;
    sx->proxy_password = conn->socks_proxy.passwd;
  }

  result = connect_SOCKS(cf, sx, data);
  if(!result && sx->state == CONNECT_DONE) {
    cf->connected = TRUE;
    Curl_verboseconnect(data, conn, cf->sockindex);
    socks_proxy_cf_free(cf);
  }

  *done = cf->connected;
  return result;
}